

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

void __thiscall
Js::ByteCodeWriter::AuxiliaryContext
          (ByteCodeWriter *this,OpCode op,RegSlot destinationRegister,void *buffer,int byteCount,
          RegSlot C1)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  undefined4 *puVar4;
  FunctionBody *pFVar5;
  uint local_4c;
  RegSlot local_48;
  OpLayoutAuxiliary data;
  
  data._4_8_ = buffer;
  CheckOpen(this);
  if (destinationRegister != 0xffffffff) {
    pFVar5 = this->m_functionWrite;
    if (pFVar5 == (FunctionBody *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (!bVar2) goto LAB_00895c0e;
      *puVar4 = 0;
      pFVar5 = this->m_functionWrite;
    }
    RVar3 = FunctionBody::MapRegSlot(pFVar5,destinationRegister);
    if (C1 != 0xffffffff) {
      pFVar5 = this->m_functionWrite;
      if (pFVar5 != (FunctionBody *)0x0) {
LAB_00895b48:
        local_48 = FunctionBody::MapRegSlot(pFVar5,C1);
        local_4c = (this->m_auxContextData).currentOffset;
        if (0 < byteCount) {
          Data::Encode(&this->m_auxContextData,(void *)data._4_8_,byteCount);
        }
        data.super_OpLayoutAuxNoReg.Offset = RVar3;
        Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
        Data::Write(&this->m_byteCodeData,&local_4c,0xc);
        return;
      }
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                  ,0x12a,"(this->m_functionWrite)","this->m_functionWrite");
      if (bVar2) {
        *puVar4 = 0;
        pFVar5 = this->m_functionWrite;
        goto LAB_00895b48;
      }
      goto LAB_00895c0e;
    }
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  *puVar4 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                              ,0x146,"(registerID != Js::Constants::NoRegister)","bad register");
  if (bVar2) {
    *puVar4 = 0;
    Throw::InternalError();
  }
LAB_00895c0e:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

void ByteCodeWriter::AuxiliaryContext(OpCode op, RegSlot destinationRegister, const void* buffer, int byteCount, Js::RegSlot C1)
    {
        CheckOpen();
        destinationRegister = ConsumeReg(destinationRegister);
        C1 = ConsumeReg(C1);

        //
        // Write the buffer's contents
        //

        int currentOffset = m_auxContextData.GetCurrentOffset();
        if (byteCount > 0)
        {
            m_auxContextData.Encode(buffer, byteCount);
        }

        //
        // Write OpCode to create new auxiliary data
        //

        OpLayoutAuxiliary data;
        data.R0 = destinationRegister;
        data.Offset = currentOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }